

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

void remove_module(MIR_context_t ctx,MIR_module_t_conflict module,int free_module_p)

{
  MIR_item_t_conflict *ppMVar1;
  MIR_item_t_conflict pMVar2;
  MIR_item_t pMVar3;
  VARR_MIR_var_t *pVVar4;
  undefined8 *puVar5;
  MIR_insn_t __ptr;
  void *pvVar6;
  MIR_insn_t_conflict pMVar7;
  DLIST_LINK_MIR_item_t *pDVar8;
  DLIST_MIR_item_t *pDVar9;
  DLIST_MIR_insn_t *insns;
  MIR_item_t_conflict func_item;
  MIR_context_t ctx_00;
  MIR_func_t pMVar10;
  MIR_item_t_conflict func_item_00;
  
  func_item_00 = (module->items).head;
  func_item = (MIR_item_t_conflict)module;
  if (func_item_00 != (MIR_item_t_conflict)0x0) {
    ppMVar1 = &(module->items).tail;
    do {
      pMVar2 = (func_item_00->item_link).prev;
      pMVar3 = (func_item_00->item_link).next;
      pDVar9 = (DLIST_MIR_item_t *)&(pMVar2->item_link).next;
      if (pMVar2 == (MIR_item_t_conflict)0x0) {
        pDVar9 = &module->items;
      }
      pDVar9->head = pMVar3;
      if (pMVar3 == (MIR_item_t)0x0) {
        pDVar8 = (DLIST_LINK_MIR_item_t *)ppMVar1;
        if (*ppMVar1 == func_item_00) goto LAB_00140460;
        remove_module_cold_1();
LAB_0014065e:
        remove_module_cold_2();
LAB_00140663:
        remove_module_cold_4();
LAB_00140668:
        remove_module_cold_5();
switchD_00140484_default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                      ,0x345,"void remove_item(MIR_context_t, MIR_item_t)");
      }
      pDVar8 = &pMVar3->item_link;
LAB_00140460:
      pDVar8->prev = pMVar2;
      (func_item_00->item_link).prev = (MIR_item_t)0x0;
      (func_item_00->item_link).next = (MIR_item_t)0x0;
      switch(func_item_00->item_type) {
      case MIR_func_item:
        remove_func_insns(ctx,func_item_00,&((func_item_00->u).func)->insns);
        func_item = func_item_00;
        remove_func_insns(ctx,func_item_00,&((func_item_00->u).func)->original_insns);
        pMVar10 = (func_item_00->u).func;
        pVVar4 = pMVar10->vars;
        if ((pVVar4 == (VARR_MIR_var_t *)0x0) || (pVVar4->varr == (MIR_var_t *)0x0))
        goto LAB_00140668;
        free(pVVar4->varr);
        free(pVVar4);
        pMVar10->vars = (VARR_MIR_var_t *)0x0;
        pMVar10 = (func_item_00->u).func;
        pVVar4 = pMVar10->global_vars;
        if (pVVar4 != (VARR_MIR_var_t *)0x0) {
          ctx_00 = (MIR_context_t)pVVar4->varr;
          if (ctx_00 == (MIR_context_t)0x0) {
            remove_module_cold_3();
            goto LAB_00140691;
          }
          free(ctx_00);
          free(pVVar4);
          pMVar10->global_vars = (VARR_MIR_var_t *)0x0;
          pMVar10 = (func_item_00->u).func;
        }
        puVar5 = (undefined8 *)pMVar10->internal;
        pvVar6 = (void *)*puVar5;
        if ((pvVar6 != (void *)0x0) && (*(void **)((long)pvVar6 + 0x10) != (void *)0x0)) {
          free(*(void **)((long)pvVar6 + 0x10));
          free(pvVar6);
          *puVar5 = 0;
          HTAB_size_t_destroy((HTAB_size_t **)(puVar5 + 1));
          HTAB_size_t_destroy((HTAB_size_t **)(puVar5 + 2));
          HTAB_size_t_destroy((HTAB_size_t **)(puVar5 + 3));
          free(pMVar10->internal);
          pMVar10->internal = (void *)0x0;
          break;
        }
        goto LAB_00140663;
      case MIR_proto_item:
        pMVar10 = (func_item_00->u).func;
        pMVar7 = (pMVar10->insns).tail;
        if ((pMVar7 == (MIR_insn_t_conflict)0x0) ||
           (__ptr = (pMVar7->insn_link).next, __ptr == (MIR_insn_t)0x0)) goto LAB_0014065e;
        free(__ptr);
        free(pMVar7);
        (pMVar10->insns).tail = (MIR_insn_t_conflict)0x0;
        break;
      case MIR_import_item:
      case MIR_export_item:
      case MIR_forward_item:
        goto switchD_00140484_caseD_2;
      case MIR_data_item:
      case MIR_ref_data_item:
      case MIR_lref_data_item:
      case MIR_expr_data_item:
      case MIR_bss_item:
        if ((func_item_00->addr != (void *)0x0) && (func_item_00->section_head_p != '\0')) {
          free(func_item_00->addr);
        }
        break;
      default:
        goto switchD_00140484_default;
      }
      free((func_item_00->u).func);
switchD_00140484_caseD_2:
      if (func_item_00->data != (void *)0x0) {
        free(func_item_00->data);
      }
      free(func_item_00);
      func_item_00 = (module->items).head;
    } while (func_item_00 != (MIR_item_t_conflict)0x0);
  }
  pvVar6 = module->data;
  if (pvVar6 != (void *)0x0) {
    ctx_00 = *(MIR_context_t *)((long)pvVar6 + 0x10);
    if (ctx_00 == (MIR_context_t)0x0) {
LAB_00140691:
      remove_module_cold_6();
      if (func_item->item_type == MIR_func_item) {
        pMVar7 = insns->head;
        while (pMVar7 != (MIR_insn_t_conflict)0x0) {
          remove_insn(ctx_00,func_item,pMVar7,insns);
          pMVar7 = insns->head;
        }
        return;
      }
      __assert_fail("func_item->item_type == MIR_func_item",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x31a,"void remove_func_insns(MIR_context_t, MIR_item_t, DLIST_MIR_insn_t *)");
    }
    free(ctx_00);
    free(pvVar6);
  }
  if (free_module_p != 0) {
    free(module);
    return;
  }
  return;
}

Assistant:

static void remove_module (MIR_context_t ctx, MIR_module_t module, int free_module_p) {
  MIR_item_t item;

  while ((item = DLIST_HEAD (MIR_item_t, module->items)) != NULL) {
    DLIST_REMOVE (MIR_item_t, module->items, item);
    remove_item (ctx, item);
  }
  if (module->data != NULL) bitmap_destroy (module->data);
  if (free_module_p) free (module);
}